

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_allocator.h
# Opt level: O1

pointer __thiscall
tcmalloc::STLPageHeapAllocator<std::_Rb_tree_node<tcmalloc::SpanPtrWithLength>,_void>::allocate
          (STLPageHeapAllocator<std::_Rb_tree_node<tcmalloc::SpanPtrWithLength>,_void> *this,
          size_type n,void *param_2)

{
  LogItem b;
  LogItem c;
  LogItem d;
  _Rb_tree_node<tcmalloc::SpanPtrWithLength> *p_Var1;
  undefined4 uStack_3c;
  anon_union_8_4_e5b1a622_for_u_ aStack_38;
  undefined4 uStack_2c;
  anon_union_8_4_e5b1a622_for_u_ aStack_28;
  undefined4 uStack_1c;
  anon_union_8_4_e5b1a622_for_u_ aStack_18;
  
  if (!underlying_.initialized) {
    underlying_.allocator.free_list_._0_4_ = 0;
    underlying_.allocator.free_list_._4_4_ = 0;
    underlying_.allocator.inuse_ = 0;
    underlying_.allocator.free_area_ = (char *)0x0;
    underlying_.allocator.free_avail_._0_4_ = 0;
    underlying_.allocator.free_avail_._4_4_ = 0;
    p_Var1 = PageHeapAllocator<std::_Rb_tree_node<tcmalloc::SpanPtrWithLength>_>::New
                       (&underlying_.allocator);
    *(ulong *)&p_Var1->super__Rb_tree_node_base =
         CONCAT44(underlying_.allocator.free_list_._4_4_,underlying_.allocator.free_list_._0_4_);
    underlying_.allocator.free_list_._0_4_ = SUB84(p_Var1,0);
    underlying_.allocator.free_list_._4_4_ = (undefined4)((ulong)p_Var1 >> 0x20);
    underlying_.allocator.inuse_ = underlying_.allocator.inuse_ + -1;
    underlying_.initialized = true;
  }
  if (n == 1) {
    p_Var1 = PageHeapAllocator<std::_Rb_tree_node<tcmalloc::SpanPtrWithLength>_>::New
                       (&underlying_.allocator);
    return p_Var1;
  }
  d._4_4_ = uStack_1c;
  d.tag_ = 4;
  c._4_4_ = uStack_2c;
  c.tag_ = 4;
  b._4_4_ = uStack_3c;
  b.tag_ = 4;
  b.u_.str = aStack_38.str;
  c.u_.str = aStack_28.str;
  d.u_.str = aStack_18.str;
  Log(kCrash,
      "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap_allocator.h"
      ,0xa2,(LogItem)(ZEXT816(0x14a0e1) << 0x40),b,c,d);
  do {
  } while( true );
}

Assistant:

pointer allocate(size_type n, const void* = 0) {
    if (!underlying_.initialized) {
      underlying_.allocator.Init();
      underlying_.initialized = true;
    }

    CHECK_CONDITION(n == 1);
    return underlying_.allocator.New();
  }